

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall
MapLoader::getMapName
          (MapLoader *this,string *mapName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords)

{
  pointer pbVar1;
  bool bVar2;
  reference pvVar3;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(lineWords,0);
  bVar2 = std::operator==(pvVar3,"name");
  if (!bVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(lineWords,0);
    bVar2 = std::operator==(pvVar3,"Name");
    if (!bVar2) {
      return;
    }
  }
  lVar4 = 0x20;
  for (uVar5 = 1;
      pbVar1 = (lineWords->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(lineWords->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + lVar4)," ");
    std::__cxx11::string::append((string *)mapName);
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void MapLoader::getMapName(std::string* mapName, std::vector<std::string>* lineWords) {
    //get map name
    if (lineWords->at(0) == "name" || lineWords->at(0) == "Name") {
        for (unsigned long i = 1; i < lineWords->size(); i++) {
            *mapName += (*lineWords)[i] + " ";
        }
    }
}